

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O2

void __thiscall chrono::ChFrame<double>::ChFrame(ChFrame<double> *this,ChCoordsys<double> *mc)

{
  this->_vptr_ChFrame = (_func_int **)&PTR__ChFrame_0019fb88;
  ChCoordsys<double>::ChCoordsys(&this->coord,mc);
  ChMatrix33<double>::Set_A_quaternion(&this->Amatrix,&mc->rot);
  return;
}

Assistant:

explicit ChFrame(const ChCoordsys<Real>& mc) : coord(mc), Amatrix(mc.rot) {}